

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

AsinhLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::AsinhLayerParams>
          (Arena *arena)

{
  AsinhLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (AsinhLayerParams *)operator_new(0x18);
    CoreML::Specification::AsinhLayerParams::AsinhLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (AsinhLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x18,(type_info *)&CoreML::Specification::AsinhLayerParams::typeinfo);
    CoreML::Specification::AsinhLayerParams::AsinhLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }